

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3mixw_io.c
# Opt level: O3

int s3mixw_write(char *fn,float32 ***mixw,uint32 n_mixw,uint32 n_feat,uint32 n_density)

{
  FILE *fp;
  int iVar1;
  int32 iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint32 chksum;
  uint32 ignore;
  undefined8 in_stack_ffffffffffffff88;
  uint32 *chksum_00;
  undefined4 uVar6;
  uint32 local_58 [2];
  char *local_50;
  FILE *local_48;
  ulong local_40;
  ulong local_38;
  
  local_58[0] = 0;
  local_58[1] = 0;
  s3clr_fattr();
  s3add_fattr("version","1.0",1);
  s3add_fattr("chksum0","yes",1);
  local_48 = s3open(fn,"wb",(uint32 *)0x0);
  iVar1 = -1;
  if (local_48 != (FILE *)0x0) {
    local_50 = fn;
    if (n_mixw != 0) {
      local_40 = (ulong)n_mixw;
      local_38 = (ulong)n_feat;
      uVar5 = 0;
      do {
        if (n_feat != 0) {
          uVar4 = 0;
          do {
            if (n_density != 0) {
              uVar3 = 0;
              do {
                if ((float)mixw[uVar5][uVar4][uVar3] < 0.0) {
                  in_stack_ffffffffffffff88 =
                       CONCAT44((int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)uVar3);
                  err_msg(ERR_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3mixw_io.c"
                          ,0xcb,"mixw[%u][%u][%u] < 0 (%e)\n",
                          (double)(float)mixw[uVar5][uVar4][uVar3],uVar5 & 0xffffffff,
                          uVar4 & 0xffffffff,in_stack_ffffffffffffff88);
                }
                uVar3 = uVar3 + 1;
              } while (n_density != uVar3);
            }
            uVar4 = uVar4 + 1;
          } while (uVar4 != local_38);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != local_40);
    }
    floor_nz_3d(mixw,n_mixw,n_feat,n_density,1.2e-38);
    fp = local_48;
    chksum_00 = local_58;
    iVar1 = bio_fwrite_3d(mixw,4,n_mixw,n_feat,n_density,local_48,chksum_00);
    uVar6 = (undefined4)((ulong)chksum_00 >> 0x20);
    if (iVar1 < 0) {
      s3close(fp);
      iVar1 = -1;
    }
    else {
      iVar2 = bio_fwrite(local_58,4,1,fp,0,local_58 + 1);
      s3close(fp);
      iVar1 = -1;
      if (iVar2 == 1) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3mixw_io.c"
                ,0xe9,"Wrote %s [%ux%ux%u array]\n",local_50,(ulong)n_mixw,CONCAT44(uVar6,n_feat),
                n_density);
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int
s3mixw_write(const char *fn,
	     float32 ***mixw,
	     uint32 n_mixw,
	     uint32 n_feat,
	     uint32 n_density)
{
    FILE *fp;
    uint32 chksum = 0;
    uint32 ignore = 0;
    uint32 i, j, k;

    s3clr_fattr();
    s3add_fattr("version", MIXW_FILE_VERSION, TRUE);
    s3add_fattr("chksum0", "yes", TRUE);

    fp = s3open(fn, "wb", NULL);
    if (fp == NULL)
	return S3_ERROR;

    for (i = 0; i < n_mixw; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		if (mixw[i][j][k] < 0) {
		    E_ERROR("mixw[%u][%u][%u] < 0 (%e)\n",
			    i,j,k,mixw[i][j][k]);
		}
	    }
	}
    }

    /* floor all non-zero entries to this value to make sure
       that results are compatible between machines */
    floor_nz_3d(mixw, n_mixw, n_feat, n_density, MIN_POS_FLOAT32);

    if (bio_fwrite_3d((void ***)mixw,
		   sizeof(float32),
		   n_mixw,
		   n_feat,
		   n_density,
		   fp,
		   &chksum) < 0) {
	s3close(fp);
	return S3_ERROR;
    }
	
    if (bio_fwrite(&chksum, sizeof(uint32), 1, fp, 0, &ignore) != 1) {
	s3close(fp);

	return S3_ERROR;
    }
	
    s3close(fp);

    E_INFO("Wrote %s [%ux%ux%u array]\n",
	   fn, n_mixw, n_feat, n_density);

    return S3_SUCCESS;
}